

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv_walk(uv_loop_t *loop,uv_walk_cb walk_cb,void *arg)

{
  QUEUE *papvVar1;
  uv_handle_t *puVar2;
  QUEUE *q_1;
  uv_handle_t *h;
  QUEUE *q;
  QUEUE queue;
  void *arg_local;
  uv_walk_cb walk_cb_local;
  uv_loop_t *loop_local;
  
  if (loop->handle_queue == (void **)loop->handle_queue[0]) {
    q = (QUEUE *)&q;
    queue[0] = &q;
  }
  else {
    q = (QUEUE *)loop->handle_queue[0];
    queue[0] = loop->handle_queue[1];
    *(QUEUE ***)queue[0] = &q;
    loop->handle_queue[1] = (*q)[1];
    *(void ***)loop->handle_queue[1] = loop->handle_queue;
    (*q)[1] = &q;
  }
  while (papvVar1 = q, (QUEUE *)&q != q) {
    puVar2 = (uv_handle_t *)(q + -2);
    *(void **)(*q)[1] = (*q)[0];
    *(void **)((long)(*q)[0] + 8) = (*q)[1];
    (*q)[0] = loop->handle_queue;
    (*papvVar1)[1] = loop->handle_queue[1];
    *(QUEUE **)(*papvVar1)[1] = papvVar1;
    loop->handle_queue[1] = papvVar1;
    if (((ulong)papvVar1[3][1] & 0x8000) == 0) {
      (*walk_cb)(puVar2,arg);
    }
  }
  return;
}

Assistant:

void uv_walk(uv_loop_t* loop, uv_walk_cb walk_cb, void* arg) {
  QUEUE queue;
  QUEUE* q;
  uv_handle_t* h;

  QUEUE_MOVE(&loop->handle_queue, &queue);
  while (!QUEUE_EMPTY(&queue)) {
    q = QUEUE_HEAD(&queue);
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    QUEUE_REMOVE(q);
    QUEUE_INSERT_TAIL(&loop->handle_queue, q);

    if (h->flags & UV__HANDLE_INTERNAL) continue;
    walk_cb(h, arg);
  }
}